

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# admin.cpp
# Opt level: O2

void Commands::Duty(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  Config *this;
  byte bVar1;
  World *this_00;
  Player *this_01;
  size_type sVar2;
  pointer ppCVar3;
  Character *character;
  bool bVar4;
  __type _Var5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  mapped_type *pmVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Map *pMVar11;
  uchar byte;
  pointer ppCVar12;
  string *psVar13;
  __node_base *p_Var14;
  long lVar15;
  _List_node_base *p_Var16;
  PacketBuilder reply;
  byte local_1a0;
  allocator<char> local_194;
  allocator<char> local_193;
  allocator<char> local_192;
  allocator<char> local_191;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  ac;
  string local_110;
  string guild_rank;
  string guild_str;
  key_type local_b0;
  key_type local_90;
  string local_70;
  string local_50;
  
  this_00 = from->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ac,"UseDutyAdmin",(allocator<char> *)&reply);
  this = &this_00->config;
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this,&ac.first);
  bVar4 = util::variant::GetBool(pmVar10);
  std::__cxx11::string::~string((string *)&ac);
  if (bVar4) {
    this_01 = from->player;
    sVar2 = (this_01->dutylast)._M_string_length;
    ppCVar3 = (this_01->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar12 = (this_01->characters).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppCVar12 != ppCVar3; ppCVar12 = ppCVar12 + 1)
    {
      character = *ppCVar12;
      if (sVar2 == 0) {
        if ((character != from) && (character->admin != ADMIN_PLAYER)) goto LAB_00117e48;
      }
      else {
        _Var5 = std::operator==(&character->real_name,&this_01->dutylast);
        if (_Var5) {
LAB_00117e48:
          if ((this_01->dutylast)._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)&this_01->dutylast);
          }
          else {
            (this_01->dutylast)._M_string_length = 0;
            *(this_01->dutylast)._M_dataplus._M_p = '\0';
          }
          if (character != (Character *)0x0) {
            Character::Logout(from);
            this_01->character = character;
            if ((sVar2 == 0) &&
               (psVar13 = (arguments->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,
               (arguments->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish != psVar13)) {
              util::lowercase(&ac.first,psVar13);
              bVar4 = std::operator==(&ac.first,"here");
              std::__cxx11::string::~string((string *)&ac);
              if (bVar4) {
                character->mapid = from->mapid;
                character->x = from->x;
                character->y = from->y;
                character->direction = from->direction;
                character->sitting = from->sitting;
              }
            }
            (*(from->super_Command_Source)._vptr_Command_Source[2])(&ac);
            std::__cxx11::string::operator=((string *)&character->faux_name,(string *)&ac);
            std::__cxx11::string::~string((string *)&ac);
            World::Login(this_00,character);
            Character::CalculateStats(character,true);
            Character::GuildNameString_abi_cxx11_(&guild_str,character);
            Character::GuildRankString_abi_cxx11_(&guild_rank,character);
            (*(character->super_Command_Source)._vptr_Command_Source[2])(&ac,character);
            PacketBuilder::PacketBuilder
                      (&reply,PACKET_WELCOME,PACKET_REPLY,
                       guild_rank._M_string_length +
                       ac.first._M_string_length + (character->title)._M_string_length +
                       guild_str._M_string_length + 0x90);
            std::__cxx11::string::~string((string *)&ac);
            PacketBuilder::AddShort(&reply,1);
            iVar6 = Character::PlayerID(character);
            PacketBuilder::AddShort(&reply,iVar6);
            PacketBuilder::AddInt(&reply,character->id);
            PacketBuilder::AddShort(&reply,(int)character->mapid);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ac,"GlobalPK",(allocator<char> *)&local_110);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&ac.first);
            bVar4 = util::variant::GetBool(pmVar10);
            if (bVar4) {
              bVar4 = World::PKExcept(this_00,(int)character->mapid);
              std::__cxx11::string::~string((string *)&ac);
              if (bVar4) goto LAB_00118095;
              byte = '\x01';
              PacketBuilder::AddByte(&reply,0xff);
            }
            else {
              std::__cxx11::string::~string((string *)&ac);
LAB_00118095:
              pMVar11 = World::GetMap(this_00,character->mapid);
              PacketBuilder::AddByte(&reply,pMVar11->rid[0]);
              pMVar11 = World::GetMap(this_00,character->mapid);
              byte = pMVar11->rid[1];
            }
            PacketBuilder::AddByte(&reply,byte);
            pMVar11 = World::GetMap(this_00,character->mapid);
            PacketBuilder::AddByte(&reply,pMVar11->rid[2]);
            pMVar11 = World::GetMap(this_00,character->mapid);
            PacketBuilder::AddByte(&reply,pMVar11->rid[3]);
            pMVar11 = World::GetMap(this_00,character->mapid);
            PacketBuilder::AddThree(&reply,pMVar11->filesize);
            PacketBuilder::AddByte(&reply,(this_00->eif->rid)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->eif->rid)._M_elems[1]);
            PacketBuilder::AddByte(&reply,(this_00->eif->rid)._M_elems[2]);
            PacketBuilder::AddByte(&reply,(this_00->eif->rid)._M_elems[3]);
            PacketBuilder::AddByte(&reply,(this_00->eif->len)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->eif->len)._M_elems[1]);
            PacketBuilder::AddByte(&reply,(this_00->enf->rid)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->enf->rid)._M_elems[1]);
            PacketBuilder::AddByte(&reply,(this_00->enf->rid)._M_elems[2]);
            PacketBuilder::AddByte(&reply,(this_00->enf->rid)._M_elems[3]);
            PacketBuilder::AddByte(&reply,(this_00->enf->len)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->enf->len)._M_elems[1]);
            PacketBuilder::AddByte(&reply,(this_00->esf->rid)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->esf->rid)._M_elems[1]);
            PacketBuilder::AddByte(&reply,(this_00->esf->rid)._M_elems[2]);
            PacketBuilder::AddByte(&reply,(this_00->esf->rid)._M_elems[3]);
            PacketBuilder::AddByte(&reply,(this_00->esf->len)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->esf->len)._M_elems[1]);
            PacketBuilder::AddByte(&reply,(this_00->ecf->rid)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->ecf->rid)._M_elems[1]);
            PacketBuilder::AddByte(&reply,(this_00->ecf->rid)._M_elems[2]);
            PacketBuilder::AddByte(&reply,(this_00->ecf->rid)._M_elems[3]);
            PacketBuilder::AddByte(&reply,(this_00->ecf->len)._M_elems[0]);
            PacketBuilder::AddByte(&reply,(this_00->ecf->len)._M_elems[1]);
            (*(character->super_Command_Source)._vptr_Command_Source[2])(&ac,character);
            PacketBuilder::AddBreakString(&reply,&ac.first,0xff);
            std::__cxx11::string::~string((string *)&ac);
            PacketBuilder::AddBreakString(&reply,&character->title,0xff);
            PacketBuilder::AddBreakString(&reply,&guild_str,0xff);
            PacketBuilder::AddBreakString(&reply,&guild_rank,0xff);
            PacketBuilder::AddChar(&reply,(uint)character->clas);
            Character::PaddedGuildTag_abi_cxx11_(&ac.first,character);
            PacketBuilder::AddString(&reply,&ac.first);
            std::__cxx11::string::~string((string *)&ac);
            p_Var14 = &(this_00->admin_config).
                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       ._M_h._M_before_begin;
            local_1a0 = 4;
            while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
              ::pair(&ac,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                          *)(p_Var14 + 1));
              bVar4 = std::operator==(&ac.first,"killnpc");
              if ((!bVar4) && (bVar4 = std::operator==(&ac.first,"reports"), !bVar4)) {
                util::variant::GetString_abi_cxx11_(&local_110,&ac.second);
                iVar6 = util::to_int(&local_110);
                bVar1 = (byte)iVar6;
                if (local_1a0 < (byte)iVar6) {
                  bVar1 = local_1a0;
                }
                std::__cxx11::string::~string((string *)&local_110);
                local_1a0 = bVar1;
              }
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
              ::~pair(&ac);
            }
            uVar7 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ac,"seehide",(allocator<char> *)&local_110);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this_00->admin_config,&ac.first);
            iVar6 = util::variant::GetInt(pmVar10);
            if ((int)(uVar7 & 0xff) < iVar6) {
              std::__cxx11::string::~string((string *)&ac);
LAB_00118503:
              uVar7 = (*(character->super_Command_Source)._vptr_Command_Source[1])(character);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&ac,"nowall",(allocator<char> *)&local_110);
              pmVar10 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this_00->admin_config,&ac.first);
              iVar6 = util::variant::GetInt(pmVar10);
              if ((int)(uVar7 & 0xff) < iVar6) {
                std::__cxx11::string::~string((string *)&ac);
              }
              else {
                iVar6 = (*(character->super_Command_Source)._vptr_Command_Source[1])(character);
                std::__cxx11::string::~string((string *)&ac);
                uVar7 = 3;
                if ((byte)iVar6 < 3) goto LAB_0011862c;
              }
              iVar6 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
              if (local_1a0 <= (byte)iVar6) {
                iVar6 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
                uVar7 = 1;
                if ((char)iVar6 == '\0') goto LAB_0011862c;
              }
              uVar7 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
              uVar7 = uVar7 & 0xff;
            }
            else {
              iVar6 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
              std::__cxx11::string::~string((string *)&ac);
              if (3 < (byte)iVar6) goto LAB_00118503;
              uVar7 = 4;
            }
LAB_0011862c:
            PacketBuilder::AddChar(&reply,uVar7);
            PacketBuilder::AddChar(&reply,(uint)character->level);
            PacketBuilder::AddInt(&reply,character->exp);
            PacketBuilder::AddInt(&reply,character->usage);
            PacketBuilder::AddShort(&reply,character->hp);
            PacketBuilder::AddShort(&reply,character->maxhp);
            PacketBuilder::AddShort(&reply,character->tp);
            PacketBuilder::AddShort(&reply,character->maxtp);
            PacketBuilder::AddShort(&reply,character->maxsp);
            PacketBuilder::AddShort(&reply,character->statpoints);
            PacketBuilder::AddShort(&reply,character->skillpoints);
            PacketBuilder::AddShort(&reply,character->karma);
            PacketBuilder::AddShort(&reply,character->mindam);
            PacketBuilder::AddShort(&reply,character->maxdam);
            PacketBuilder::AddShort(&reply,character->accuracy);
            PacketBuilder::AddShort(&reply,character->evade);
            PacketBuilder::AddShort(&reply,character->armor);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ac,"OldVersionCompat",(allocator<char> *)&local_110);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&ac.first);
            bVar4 = util::variant::GetBool(pmVar10);
            if (bVar4) {
              std::__cxx11::string::~string((string *)&ac);
            }
            else {
              iVar6 = this_01->client->version;
              std::__cxx11::string::~string((string *)&ac);
              if (iVar6 < 0x1c) {
                PacketBuilder::AddChar(&reply,*character->display_str);
                PacketBuilder::AddChar(&reply,*character->display_wis);
                PacketBuilder::AddChar(&reply,*character->display_intl);
                PacketBuilder::AddChar(&reply,*character->display_agi);
                PacketBuilder::AddChar(&reply,*character->display_con);
                PacketBuilder::AddChar(&reply,*character->display_cha);
                goto LAB_00118887;
              }
            }
            PacketBuilder::AddShort(&reply,*character->display_str);
            PacketBuilder::AddShort(&reply,*character->display_wis);
            PacketBuilder::AddShort(&reply,*character->display_intl);
            PacketBuilder::AddShort(&reply,*character->display_agi);
            PacketBuilder::AddShort(&reply,*character->display_con);
            PacketBuilder::AddShort(&reply,*character->display_cha);
LAB_00118887:
            for (lVar15 = 0x2e8; lVar15 != 0x324; lVar15 = lVar15 + 4) {
              PacketBuilder::AddShort
                        (&reply,*(int *)((long)&(character->super_Command_Source).
                                                _vptr_Command_Source + lVar15));
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ac,"GuildEditRank",&local_191);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&ac.first);
            iVar8 = util::variant::GetInt(pmVar10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_110,"GuildKickRank",&local_192);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&local_110);
            iVar6 = util::variant::GetInt(pmVar10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"GuildPromoteRank",&local_193);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&local_90);
            iVar9 = util::variant::GetInt(pmVar10);
            if (iVar6 < iVar8) {
              iVar6 = iVar8;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"GuildDemoteRank",&local_194);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&local_b0);
            iVar8 = util::variant::GetInt(pmVar10);
            if (iVar9 < iVar6) {
              iVar9 = iVar6;
            }
            if (iVar9 <= iVar8) {
              iVar9 = iVar8;
            }
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&ac);
            bVar1 = character->guild_rank;
            uVar7 = (uint)bVar1;
            if (((int)(uint)bVar1 <= iVar9) &&
               (uVar7 = (uint)bVar1,
               (character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0)) {
              uVar7 = 1;
            }
            PacketBuilder::AddChar(&reply,uVar7);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ac,"JailMap",(allocator<char> *)&local_110);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this,&ac.first);
            iVar6 = util::variant::GetInt(pmVar10);
            PacketBuilder::AddShort(&reply,iVar6);
            std::__cxx11::string::~string((string *)&ac);
            PacketBuilder::AddShort(&reply,4);
            PacketBuilder::AddChar(&reply,0x18);
            PacketBuilder::AddChar(&reply,0x18);
            PacketBuilder::AddShort(&reply,0);
            PacketBuilder::AddShort(&reply,0);
            PacketBuilder::AddShort(&reply,0);
            PacketBuilder::AddShort(&reply,2);
            PacketBuilder::AddChar(&reply,0);
            PacketBuilder::AddByte(&reply,0xff);
            Player::Send(this_01,&reply);
            PacketBuilder::~PacketBuilder(&reply);
            std::__cxx11::string::~string((string *)&guild_rank);
            std::__cxx11::string::~string((string *)&guild_str);
            (*(character->super_Command_Source)._vptr_Command_Source[2])(&reply,character);
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)&ac,PACKET_WELCOME,PACKET_REPLY,
                       (size_t)(reply.data._M_dataplus._M_p +
                               (character->spells).
                               super__List_base<Character_Spell,_std::allocator<Character_Spell>_>.
                               _M_impl._M_node._M_size * 4 +
                               (character->inventory).
                               super__List_base<Character_Item,_std::allocator<Character_Item>_>.
                               _M_impl._M_node._M_size * 6 + 0x41));
            std::__cxx11::string::~string((string *)&reply);
            PacketBuilder::AddShort((PacketBuilder *)&ac,2);
            PacketBuilder::AddByte((PacketBuilder *)&ac,0xff);
            iVar6 = 9;
            while (bVar4 = iVar6 != 0, iVar6 = iVar6 + -1, bVar4) {
              PacketBuilder::AddByte((PacketBuilder *)&ac,0xff);
            }
            PacketBuilder::AddChar((PacketBuilder *)&ac,character->weight);
            PacketBuilder::AddChar((PacketBuilder *)&ac,character->maxweight);
            p_Var16 = (_List_node_base *)&character->inventory;
            while (p_Var16 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                              &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                  p_Var16 != (_List_node_base *)&character->inventory) {
              iVar6 = *(int *)((long)&p_Var16[1]._M_next + 4);
              PacketBuilder::AddShort((PacketBuilder *)&ac,(int)*(short *)&p_Var16[1]._M_next);
              PacketBuilder::AddInt((PacketBuilder *)&ac,iVar6);
            }
            PacketBuilder::AddByte((PacketBuilder *)&ac,0xff);
            p_Var16 = (_List_node_base *)&character->spells;
            while (p_Var16 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)
                              &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                  p_Var16 != (_List_node_base *)&character->spells) {
              bVar1 = *(undefined1 *)((long)&p_Var16[1]._M_next + 2);
              PacketBuilder::AddShort((PacketBuilder *)&ac,(int)*(short *)&p_Var16[1]._M_next);
              PacketBuilder::AddShort((PacketBuilder *)&ac,(uint)bVar1);
            }
            PacketBuilder::AddByte((PacketBuilder *)&ac,0xff);
            PacketBuilder::AddChar((PacketBuilder *)&ac,1);
            PacketBuilder::AddByte((PacketBuilder *)&ac,0xff);
            (*(character->super_Command_Source)._vptr_Command_Source[2])(&reply,character);
            PacketBuilder::AddBreakString((PacketBuilder *)&ac,(string *)&reply,0xff);
            std::__cxx11::string::~string((string *)&reply);
            iVar6 = Character::PlayerID(character);
            PacketBuilder::AddShort((PacketBuilder *)&ac,iVar6);
            PacketBuilder::AddShort((PacketBuilder *)&ac,(int)character->mapid);
            PacketBuilder::AddShort((PacketBuilder *)&ac,(uint)character->x);
            PacketBuilder::AddShort((PacketBuilder *)&ac,(uint)character->y);
            PacketBuilder::AddChar((PacketBuilder *)&ac,(uint)character->direction);
            PacketBuilder::AddChar((PacketBuilder *)&ac,6);
            Character::PaddedGuildTag_abi_cxx11_((string *)&reply,character);
            PacketBuilder::AddString((PacketBuilder *)&ac,(string *)&reply);
            std::__cxx11::string::~string((string *)&reply);
            PacketBuilder::AddChar((PacketBuilder *)&ac,(uint)character->level);
            PacketBuilder::AddChar((PacketBuilder *)&ac,(uint)character->gender);
            PacketBuilder::AddChar((PacketBuilder *)&ac,(uint)character->hairstyle);
            PacketBuilder::AddChar((PacketBuilder *)&ac,(uint)character->haircolor);
            PacketBuilder::AddChar((PacketBuilder *)&ac,(uint)character->race);
            PacketBuilder::AddShort((PacketBuilder *)&ac,character->maxhp);
            PacketBuilder::AddShort((PacketBuilder *)&ac,character->hp);
            PacketBuilder::AddShort((PacketBuilder *)&ac,character->maxtp);
            PacketBuilder::AddShort((PacketBuilder *)&ac,character->tp);
            Character::AddPaperdollData(character,(PacketBuilder *)&ac,"B000A0HSW");
            PacketBuilder::AddChar((PacketBuilder *)&ac,(uint)character->sitting);
            PacketBuilder::AddChar((PacketBuilder *)&ac,character->hidden & 1);
            PacketBuilder::AddByte((PacketBuilder *)&ac,0xff);
            PacketBuilder::AddByte((PacketBuilder *)&ac,0xff);
            Player::Send(this_01,(PacketBuilder *)&ac);
            PacketBuilder::~PacketBuilder((PacketBuilder *)&ac);
            Character::Warp(character,character->mapid,character->x,character->y,WARP_ANIMATION_NONE
                           );
            return;
          }
          break;
        }
      }
    }
    iVar6 = (*(from->super_Command_Source)._vptr_Command_Source[4])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ac,"character_not_found",(allocator<char> *)&reply);
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var_00,iVar6) + 0x490),&ac.first);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
    psVar13 = &local_70;
  }
  else {
    iVar6 = (*(from->super_Command_Source)._vptr_Command_Source[4])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ac,"unknown_command",(allocator<char> *)&reply);
    I18N::Format<>(&local_50,(I18N *)(CONCAT44(extraout_var,iVar6) + 0x490),&ac.first);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_50);
    psVar13 = &local_50;
  }
  std::__cxx11::string::~string((string *)psVar13);
  std::__cxx11::string::~string((string *)&ac);
  return;
}

Assistant:

void Duty(const std::vector<std::string>& arguments, Character* from)
{
	World* world = from->world;

	if (!world->config["UseDutyAdmin"])
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return;
	}

	Player* player = from->player;
	Character* swap = nullptr;

	bool dutyoff = !player->dutylast.empty();

	for (Character* c : from->player->characters)
	{
		if ((dutyoff && c->real_name == player->dutylast)
		 || (!dutyoff && c != from && c->admin))
		{
			if (player->dutylast.empty())
				player->dutylast = from->real_name;
			else
				player->dutylast.clear();

			swap = c;
			break;
		}
	}

	if (!swap)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
		return;
	}

	from->Logout();
	player->character = swap;

	if (!dutyoff && arguments.size() > 0 && util::lowercase(arguments[0]) == "here")
	{
		swap->mapid = from->mapid;
		swap->x = from->x;
		swap->y = from->y;
		swap->direction = from->direction;
		swap->sitting = from->sitting;
	}

	swap->faux_name = from->SourceName();

	world->Login(swap);
	swap->CalculateStats();

	{
		std::string guild_str = swap->GuildNameString();
		std::string guild_rank = swap->GuildRankString();

		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY,
			114 + swap->paperdoll.size() * 2 + swap->SourceName().length() + swap->title.length()
			+ guild_str.length() + guild_rank.length());

		reply.AddShort(1); // REPLY_WELCOME sub-id
		reply.AddShort(swap->PlayerID());
		reply.AddInt(swap->id);
		reply.AddShort(swap->mapid); // Map ID

		if (world->config["GlobalPK"] && !world->PKExcept(swap->mapid))
		{
			reply.AddByte(0xFF);
			reply.AddByte(0x01);
		}
		else
		{
			reply.AddByte(world->GetMap(swap->mapid)->rid[0]);
			reply.AddByte(world->GetMap(swap->mapid)->rid[1]);
		}

		reply.AddByte(world->GetMap(swap->mapid)->rid[2]);
		reply.AddByte(world->GetMap(swap->mapid)->rid[3]);
		reply.AddThree(world->GetMap(swap->mapid)->filesize);
		reply.AddByte(world->eif->rid[0]);
		reply.AddByte(world->eif->rid[1]);
		reply.AddByte(world->eif->rid[2]);
		reply.AddByte(world->eif->rid[3]);
		reply.AddByte(world->eif->len[0]);
		reply.AddByte(world->eif->len[1]);
		reply.AddByte(world->enf->rid[0]);
		reply.AddByte(world->enf->rid[1]);
		reply.AddByte(world->enf->rid[2]);
		reply.AddByte(world->enf->rid[3]);
		reply.AddByte(world->enf->len[0]);
		reply.AddByte(world->enf->len[1]);
		reply.AddByte(world->esf->rid[0]);
		reply.AddByte(world->esf->rid[1]);
		reply.AddByte(world->esf->rid[2]);
		reply.AddByte(world->esf->rid[3]);
		reply.AddByte(world->esf->len[0]);
		reply.AddByte(world->esf->len[1]);
		reply.AddByte(world->ecf->rid[0]);
		reply.AddByte(world->ecf->rid[1]);
		reply.AddByte(world->ecf->rid[2]);
		reply.AddByte(world->ecf->rid[3]);
		reply.AddByte(world->ecf->len[0]);
		reply.AddByte(world->ecf->len[1]);
		reply.AddBreakString(swap->SourceName());
		reply.AddBreakString(swap->title);
		reply.AddBreakString(guild_str); // Guild Name
		reply.AddBreakString(guild_rank); // Guild Rank
		reply.AddChar(swap->clas);
		reply.AddString(swap->PaddedGuildTag());

		// Tell a player's client they're a higher level admin than they are to enable some features

		AdminLevel lowest_command = ADMIN_HGM;

		UTIL_FOREACH(world->admin_config, ac)
		{
			if (ac.first == "killnpc" || ac.first == "reports")
			{
				continue;
			}

			lowest_command = std::min<AdminLevel>(lowest_command, static_cast<AdminLevel>(util::to_int(ac.second)));
		}

		if (swap->SourceAccess() >= static_cast<int>(world->admin_config["seehide"])
		 && swap->SourceAccess() < ADMIN_HGM)
		{
			reply.AddChar(ADMIN_HGM);
		}
		else if (swap->SourceDutyAccess() >= static_cast<int>(world->admin_config["nowall"])
		 && swap->SourceDutyAccess() < ADMIN_GM)
		{
			reply.AddChar(ADMIN_GM);
		}
		else if (swap->SourceAccess() >= lowest_command
		 && swap->SourceAccess() < ADMIN_GUIDE)
		{
			reply.AddChar(ADMIN_GUIDE);
		}
		else
		{
			reply.AddChar(swap->SourceAccess());
		}

		reply.AddChar(swap->level);
		reply.AddInt(swap->exp);
		reply.AddInt(swap->usage);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->tp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->maxsp);
		reply.AddShort(swap->statpoints);
		reply.AddShort(swap->skillpoints);
		reply.AddShort(swap->karma);
		reply.AddShort(swap->mindam);
		reply.AddShort(swap->maxdam);
		reply.AddShort(swap->accuracy);
		reply.AddShort(swap->evade);
		reply.AddShort(swap->armor);

		if (!world->config["OldVersionCompat"] && player->client->version < 28)
		{
			reply.AddChar(swap->display_str);
			reply.AddChar(swap->display_wis);
			reply.AddChar(swap->display_intl);
			reply.AddChar(swap->display_agi);
			reply.AddChar(swap->display_con);
			reply.AddChar(swap->display_cha);
		}
		else
		{
			reply.AddShort(swap->display_str);
			reply.AddShort(swap->display_wis);
			reply.AddShort(swap->display_intl);
			reply.AddShort(swap->display_agi);
			reply.AddShort(swap->display_con);
			reply.AddShort(swap->display_cha);
		}

		UTIL_FOREACH(swap->paperdoll, item)
		{
			reply.AddShort(item);
		}

		int leader_rank = std::max(std::max(std::max(static_cast<int>(world->config["GuildEditRank"]), static_cast<int>(world->config["GuildKickRank"])),
								   static_cast<int>(world->config["GuildPromoteRank"])), static_cast<int>(world->config["GuildDemoteRank"]));

		if (swap->guild_rank <= leader_rank && swap->guild)
		{
			reply.AddChar(1); // Allows client access to the guild management tools
		}
		else
		{
			reply.AddChar(swap->guild_rank);
		}

		reply.AddShort(static_cast<int>(world->config["JailMap"]));
		reply.AddShort(4); // ?
		reply.AddChar(24); // ?
		reply.AddChar(24); // ?
		reply.AddShort(0); // Light guide admin command flood rate
		reply.AddShort(0); // Guardian admin command flood rate
		reply.AddShort(0); // GM/HGM admin command flood rate
		reply.AddShort(2); // ?
		reply.AddChar(0); // Login warning message
		reply.AddByte(255);

		player->Send(reply);
	}

	{
		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY, 65 + swap->SourceName().length() + swap->inventory.size() * 6 + swap->spells.size() * 4);

		reply.AddShort(2); // REPLY_WELCOME sub-id
		// MotDs
		reply.AddByte(255);

		for (int i = 0; i < 9; ++i)
		{
			reply.AddByte(255);
		}

		// ??
		reply.AddChar(swap->weight); // Weight
		reply.AddChar(swap->maxweight); // Max Weight
		UTIL_FOREACH(swap->inventory, item)
		{
			reply.AddShort(item.id);
			reply.AddInt(item.amount);
		}
		reply.AddByte(255);
		UTIL_FOREACH(swap->spells, spell)
		{
			reply.AddShort(spell.id); // Spell ID
			reply.AddShort(spell.level); // Spell Level
		}
		reply.AddByte(255);

		reply.AddChar(1); // Number of players
		reply.AddByte(255);

		reply.AddBreakString(swap->SourceName());
		reply.AddShort(swap->PlayerID());
		reply.AddShort(swap->mapid);
		reply.AddShort(swap->x);
		reply.AddShort(swap->y);
		reply.AddChar(swap->direction);
		reply.AddChar(6); // ?
		reply.AddString(swap->PaddedGuildTag());
		reply.AddChar(swap->level);
		reply.AddChar(swap->gender);
		reply.AddChar(swap->hairstyle);
		reply.AddChar(swap->haircolor);
		reply.AddChar(swap->race);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->tp);
		swap->AddPaperdollData(reply, "B000A0HSW");
		reply.AddChar(swap->sitting);
		reply.AddChar(swap->IsHideInvisible());
		reply.AddByte(255);

		reply.AddByte(255);

		player->Send(reply);
	}

	swap->Warp(swap->mapid, swap->x, swap->y, WARP_ANIMATION_NONE);
}